

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedCharException.cpp
# Opt level: O2

void __thiscall
antlr::MismatchedCharException::MismatchedCharException
          (MismatchedCharException *this,int c,BitSet *set_,bool matchNot,CharScanner *scanner_)

{
  int iVar1;
  int line_;
  int column_;
  undefined4 extraout_var;
  allocator<char> local_59;
  BitSet *local_58;
  string local_50;
  
  local_58 = set_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Mismatched char",&local_59);
  iVar1 = (*(scanner_->super_TokenStream)._vptr_TokenStream[0x1a])(scanner_);
  line_ = (*(scanner_->super_TokenStream)._vptr_TokenStream[0x16])(scanner_);
  column_ = (*(scanner_->super_TokenStream)._vptr_TokenStream[0x18])(scanner_);
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_50,(string *)CONCAT44(extraout_var,iVar1),
             line_,column_);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedCharException_001fee80;
  this->mismatchType = matchNot + 5;
  this->foundChar = c;
  std::vector<bool,_std::allocator<bool>_>::vector(&(this->set).storage,&local_58->storage);
  this->scanner = scanner_;
  return;
}

Assistant:

MismatchedCharException::MismatchedCharException(
	int c,
	BitSet set_,
	bool matchNot,
	CharScanner* scanner_
) : RecognitionException("Mismatched char",
                         scanner_->getFilename(),
								 scanner_->getLine(), scanner_->getColumn())
  , mismatchType(matchNot ? NOT_SET : SET)
  , foundChar(c)
  , set(set_)
  , scanner(scanner_)
{
}